

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O0

void EOPLL_calcStereo(EOPLL *opll,int32_t *out)

{
  int32_t iVar1;
  int32_t *out_local;
  EOPLL *opll_local;
  
  while (opll->out_time <= opll->out_step && opll->out_step != opll->out_time) {
    opll->out_time = opll->inp_step + opll->out_time;
    update_output(opll);
    mix_output_stereo(opll);
  }
  opll->out_time = opll->out_time - opll->out_step;
  if (opll->conv == (EOPLL_RateConv *)0x0) {
    *out = opll->mix_out[0];
    out[1] = opll->mix_out[1];
  }
  else {
    iVar1 = EOPLL_RateConv_getData(opll->conv,0);
    *out = iVar1;
    iVar1 = EOPLL_RateConv_getData(opll->conv,1);
    out[1] = iVar1;
  }
  return;
}

Assistant:

void EOPLL_calcStereo(EOPLL *opll, int32_t out[2]) {
  while (opll->out_step > opll->out_time) {
    opll->out_time += opll->inp_step;
    update_output(opll);
    mix_output_stereo(opll);
  }
  opll->out_time -= opll->out_step;
  if (opll->conv) {
    out[0] = EOPLL_RateConv_getData(opll->conv, 0);
    out[1] = EOPLL_RateConv_getData(opll->conv, 1);
  } else {
    out[0] = opll->mix_out[0];
    out[1] = opll->mix_out[1];
  }
}